

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  __m128 _outp;
  __m128 _p;
  __m128 _b_128;
  int i;
  float b;
  binary_op_atan2 op;
  __m128 special_result;
  __m128 negative_mask_full_x;
  __m128 normal_result;
  __m128 pi_additions;
  __m128 negative_mask_y;
  __m128 negative_mask_x;
  __m128 normal_mode;
  __m128 not_equal_zero_y;
  __m128 not_equal_zero_x;
  __m128 magic_half_pi;
  __m128 magic_pi;
  __m128 magic_negative_zero;
  __m128 magic_zero;
  __m128 output_approx;
  __m128 fourth_power_of_input_approx;
  __m128 square_of_input_approx;
  __m128 input_approx;
  __m128 is_small_input;
  __m128 absolute;
  __m128 negative_mask;
  __m128 magic_a8;
  __m128 magic_a7;
  __m128 magic_a6;
  __m128 magic_a5;
  __m128 magic_a4;
  __m128 magic_a3;
  __m128 magic_a2;
  __m128 magic_a1;
  __m128 magic_a0;
  __m128 magic_half_pi_1;
  __m128 magic_negative_one;
  __m128 magic_one;
  __m128 magic_negative_zero_1;
  ulong local_de8;
  ulong uStack_de0;
  ulong local_dc8;
  ulong uStack_dc0;
  ulong local_db8;
  ulong uStack_db0;
  int local_da4;
  float local_da0;
  undefined1 local_d99 [5];
  int local_d94;
  float *local_d90;
  undefined1 (*local_d80) [16];
  undefined1 (*local_d78) [16];
  ulong local_d68;
  ulong uStack_d60;
  float *local_d50;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  float local_d38;
  ulong *local_d28;
  ulong *local_d20;
  undefined1 *local_d18;
  float *local_d10;
  undefined1 (*local_d08) [16];
  undefined1 *local_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  int local_ce8;
  int iStack_ce4;
  int iStack_ce0;
  int iStack_cdc;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  ulong local_c98;
  ulong uStack_c90;
  int local_c88;
  int iStack_c84;
  int iStack_c80;
  int iStack_c7c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  ulong local_c28;
  ulong uStack_c20;
  ulong local_c18;
  ulong uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  ulong local_be8;
  ulong uStack_be0;
  ulong local_bd8;
  ulong uStack_bd0;
  ulong local_bc8;
  ulong uStack_bc0;
  ulong local_bb8;
  ulong uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  ulong local_b98;
  ulong uStack_b90;
  ulong local_b88;
  ulong uStack_b80;
  ulong local_b78;
  ulong uStack_b70;
  ulong local_b68;
  ulong uStack_b60;
  int local_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  undefined8 local_b48;
  undefined8 uStack_b40;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  ulong local_b28;
  ulong uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  ulong local_b08;
  ulong uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  ulong local_ae8;
  ulong uStack_ae0;
  ulong local_ad8;
  ulong uStack_ad0;
  uint local_ac8;
  uint uStack_ac4;
  uint uStack_ac0;
  uint uStack_abc;
  ulong local_ab8;
  ulong uStack_ab0;
  ulong local_aa8;
  ulong uStack_aa0;
  ulong local_a98;
  ulong uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  ulong local_a78;
  ulong uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  ulong local_a18;
  ulong uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  ulong local_9d8;
  ulong uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  ulong local_9b8;
  ulong uStack_9b0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 local_91c;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined1 local_838 [16];
  int local_828;
  int iStack_824;
  int iStack_820;
  int iStack_81c;
  ulong local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined1 local_728 [16];
  undefined8 local_718;
  undefined8 uStack_710;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  ulong local_698;
  ulong uStack_690;
  ulong local_688;
  ulong uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  ulong local_668;
  ulong uStack_660;
  ulong local_658;
  ulong uStack_650;
  ulong local_648;
  ulong uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  ulong local_628;
  ulong uStack_620;
  ulong local_618;
  ulong uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float *local_5f0;
  float *local_5e8;
  float *local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 *local_590;
  float *local_588;
  float *local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 *local_530;
  float *local_528;
  float *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 *local_4d0;
  float *local_4c8;
  float *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 *local_470;
  undefined8 *local_468;
  float *local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  float *local_408;
  float *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  float *local_3a8;
  float *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 *local_348;
  float *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_da0 = *in_RSI;
  local_da4 = 0;
  if (in_R8D == 4) {
    local_de8 = *(ulong *)in_RSI;
    uStack_de0 = *(ulong *)(in_RSI + 2);
  }
  else {
    local_de8 = CONCAT44(local_da0,local_da0);
    uStack_de0 = CONCAT44(local_da0,local_da0);
    local_d48 = local_da0;
    fStack_d44 = local_da0;
    fStack_d40 = local_da0;
    fStack_d3c = local_da0;
    local_d38 = local_da0;
  }
  local_db8 = local_de8;
  uStack_db0 = uStack_de0;
  local_d90 = in_RDX;
  local_d80 = in_RDI;
  for (; local_d94 = in_ECX, local_da4 + 3 < in_ECX; local_da4 = local_da4 + 4) {
    local_d78 = local_d80;
    local_dc8 = *(ulong *)*local_d80;
    uStack_dc0 = *(ulong *)(*local_d80 + 8);
    local_d18 = local_d99;
    local_d20 = &local_dc8;
    local_d28 = &local_db8;
    local_c28 = local_de8;
    uStack_c20 = uStack_de0;
    auVar3._8_8_ = uStack_de0;
    auVar3._0_8_ = local_de8;
    local_93c = 0;
    local_91c = 0;
    local_938 = 0;
    local_c38 = 0;
    uStack_c30 = 0;
    local_95c = 0x80000000;
    local_940 = 0x80000000;
    local_958 = 0x80000000;
    local_c48 = 0x8000000080000000;
    uStack_c40 = 0x8000000080000000;
    local_97c = 0x40490fdb;
    local_960 = 0x40490fdb;
    local_978 = 0x40490fdb;
    local_c58 = 0x40490fdb40490fdb;
    uStack_c50 = 0x40490fdb40490fdb;
    local_99c = 0x3fc90fdb;
    local_980 = 0x3fc90fdb;
    local_998 = 0x3fc90fdb;
    local_c68 = 0x3fc90fdb3fc90fdb;
    uStack_c60 = 0x3fc90fdb3fc90fdb;
    local_8e8._0_4_ = (float)local_de8;
    local_8e8._4_4_ = (float)(local_de8 >> 0x20);
    uStack_8e0._0_4_ = (float)uStack_de0;
    uStack_8e0._4_4_ = (float)(uStack_de0 >> 0x20);
    local_c78 = -(uint)((float)local_8e8 != 0.0);
    iStack_c74 = -(uint)(local_8e8._4_4_ != 0.0);
    iStack_c70 = -(uint)((float)uStack_8e0 != 0.0);
    iStack_c6c = -(uint)(uStack_8e0._4_4_ != 0.0);
    local_908._0_4_ = (float)local_dc8;
    local_908._4_4_ = (float)(local_dc8 >> 0x20);
    uStack_900._0_4_ = (float)uStack_dc0;
    uStack_900._4_4_ = (float)(uStack_dc0 >> 0x20);
    local_c88 = -(uint)((float)local_908 != 0.0);
    iStack_c84 = -(uint)(local_908._4_4_ != 0.0);
    iStack_c80 = -(uint)((float)uStack_900 != 0.0);
    iStack_c7c = -(uint)(uStack_900._4_4_ != 0.0);
    local_ad8 = CONCAT44(iStack_c74,local_c78);
    uStack_ad0 = CONCAT44(iStack_c6c,iStack_c70);
    local_ae8 = CONCAT44(iStack_c84,local_c88);
    uStack_ae0 = CONCAT44(iStack_c7c,iStack_c80);
    local_c98 = local_ad8 & local_ae8;
    uStack_c90 = uStack_ad0 & uStack_ae0;
    local_ca8 = local_de8 & 0x8000000080000000;
    uStack_ca0 = uStack_de0 & 0x8000000080000000;
    local_cb8 = local_dc8 & 0x8000000080000000;
    uStack_cb0 = uStack_dc0 & 0x8000000080000000;
    local_b58 = -(uint)((float)local_8e8 < 0.0);
    iStack_b54 = -(uint)(local_8e8._4_4_ < 0.0);
    iStack_b50 = -(uint)((float)uStack_8e0 < 0.0);
    iStack_b4c = -(uint)(uStack_8e0._4_4_ < 0.0);
    local_b38 = -(uint)((float)local_908 < 0.0);
    iStack_b34 = -(uint)(local_908._4_4_ < 0.0);
    iStack_b30 = -(uint)((float)uStack_900 < 0.0);
    iStack_b2c = -(uint)(uStack_900._4_4_ < 0.0);
    local_a18 = CONCAT44(iStack_b34,local_b38) & 0x8000000080000000;
    uStack_a10 = CONCAT44(iStack_b2c,iStack_b30) & 0x8000000080000000;
    local_b68 = local_a18 | 0x40490fdb40490fdb;
    uStack_b60 = uStack_a10 | 0x40490fdb40490fdb;
    local_cc8 = CONCAT44(iStack_b54,local_b58) & local_b68;
    uStack_cc0 = CONCAT44(iStack_b4c,iStack_b50) & uStack_b60;
    local_728 = divps(*local_d80,auVar3);
    local_ec = 0x80000000;
    local_cc = 0x80000000;
    local_e8 = 0x80000000;
    local_738 = 0x8000000080000000;
    uStack_730 = 0x8000000080000000;
    local_10c = 0x3f800000;
    local_f0 = 0x3f800000;
    local_108 = 0x3f800000;
    local_748 = 0x3f8000003f800000;
    uStack_740 = 0x3f8000003f800000;
    local_12c = 0xbf800000;
    local_110 = 0xbf800000;
    local_128 = 0xbf800000;
    local_758 = 0xbf800000bf800000;
    uStack_750 = 0xbf800000bf800000;
    local_14c = 0x3fc90fdb;
    local_130 = 0x3fc90fdb;
    local_148 = 0x3fc90fdb;
    local_768 = 0x3fc90fdb3fc90fdb;
    uStack_760 = 0x3fc90fdb3fc90fdb;
    local_16c = 0x3f800000;
    local_150 = 0x3f800000;
    local_168 = 0x3f800000;
    local_778 = 0x3f8000003f800000;
    uStack_770 = 0x3f8000003f800000;
    local_18c = 0xbeaaaa53;
    local_170 = 0xbeaaaa53;
    local_188 = 0xbeaaaa53;
    local_788 = 0xbeaaaa53beaaaa53;
    uStack_780 = 0xbeaaaa53beaaaa53;
    local_1ac = 0x3e4cb974;
    local_190 = 0x3e4cb974;
    local_1a8 = 0x3e4cb974;
    local_798 = 0x3e4cb9743e4cb974;
    uStack_790 = 0x3e4cb9743e4cb974;
    local_1cc = 0xbe117200;
    local_1b0 = 0xbe117200;
    local_1c8 = 0xbe117200;
    local_7a8 = 0xbe117200be117200;
    uStack_7a0 = 0xbe117200be117200;
    local_1ec = 0x3dd9ed24;
    local_1d0 = 0x3dd9ed24;
    local_1e8 = 0x3dd9ed24;
    local_7b8 = 0x3dd9ed243dd9ed24;
    uStack_7b0 = 0x3dd9ed243dd9ed24;
    local_20c = 0xbd99b01e;
    local_1f0 = 0xbd99b01e;
    local_208 = 0xbd99b01e;
    local_7c8 = 0xbd99b01ebd99b01e;
    uStack_7c0 = 0xbd99b01ebd99b01e;
    local_22c = 0x3d2edd4e;
    local_210 = 0x3d2edd4e;
    local_228 = 0x3d2edd4e;
    local_7d8 = 0x3d2edd4e3d2edd4e;
    uStack_7d0 = 0x3d2edd4e3d2edd4e;
    local_24c = 0xbc83a25c;
    local_230 = 0xbc83a25c;
    local_248 = 0xbc83a25c;
    local_7e8 = 0xbc83a25cbc83a25c;
    uStack_7e0 = 0xbc83a25cbc83a25c;
    local_26c = 0x3b3ac537;
    local_250 = 0x3b3ac537;
    local_268 = 0x3b3ac537;
    local_7f8 = 0x3b3ac5373b3ac537;
    uStack_7f0 = 0x3b3ac5373b3ac537;
    local_618 = local_728._0_8_;
    uStack_610 = local_728._8_8_;
    local_808 = local_728._0_8_ & 0x8000000080000000;
    uStack_800 = local_728._8_8_ & 0x8000000080000000;
    local_88 = local_728._0_8_;
    uStack_80 = local_728._8_8_;
    local_818 = local_728._0_8_ & 0x7fffffff7fffffff;
    uStack_810 = local_728._8_8_ & 0x7fffffff7fffffff;
    local_298._0_4_ = (float)local_818;
    local_298._4_4_ = (float)(local_818 >> 0x20);
    uStack_290._0_4_ = (float)uStack_810;
    uStack_290._4_4_ = (float)(uStack_810 >> 0x20);
    local_828 = -(uint)(1.0 < (float)local_298);
    iStack_824 = -(uint)(1.0 < local_298._4_4_);
    iStack_820 = -(uint)(1.0 < (float)uStack_290);
    iStack_81c = -(uint)(1.0 < uStack_290._4_4_);
    local_628 = CONCAT44(iStack_824,local_828);
    uStack_620 = CONCAT44(iStack_81c,iStack_820);
    local_2a8 = local_628 & 0xbf800000bf800000;
    uStack_2a0 = uStack_620 & 0xbf800000bf800000;
    local_98 = CONCAT44(iStack_824,local_828);
    uStack_90 = CONCAT44(iStack_81c,iStack_820);
    local_2b8 = ~local_98 & local_818;
    uStack_2b0 = ~uStack_90 & uStack_810;
    local_688 = local_2a8 | local_2b8;
    uStack_680 = uStack_2a0 | uStack_2b0;
    local_648 = CONCAT44(iStack_824,local_828);
    uStack_640 = CONCAT44(iStack_81c,iStack_820);
    local_2c8 = local_648 & local_818;
    uStack_2c0 = uStack_640 & uStack_810;
    local_b8 = CONCAT44(iStack_824,local_828);
    uStack_b0 = CONCAT44(iStack_81c,iStack_820);
    local_2d8 = ~local_b8 & 0x3f8000003f800000;
    uStack_2d0 = ~uStack_b0 & 0x3f8000003f800000;
    local_698 = local_2c8 | local_2d8;
    uStack_690 = uStack_2c0 | uStack_2d0;
    auVar2._8_8_ = uStack_680;
    auVar2._0_8_ = local_688;
    auVar1._8_8_ = uStack_690;
    auVar1._0_8_ = local_698;
    local_838 = divps(auVar2,auVar1);
    local_6b8 = local_838._0_8_;
    uStack_6b0 = local_838._8_8_;
    local_6a8._0_4_ = local_838._0_4_;
    local_6a8._4_4_ = local_838._4_4_;
    uStack_6a0._0_4_ = local_838._8_4_;
    uStack_6a0._4_4_ = local_838._12_4_;
    local_848 = (float)local_6a8 * (float)local_6a8;
    fStack_844 = local_6a8._4_4_ * local_6a8._4_4_;
    fStack_840 = (float)uStack_6a0 * (float)uStack_6a0;
    fStack_83c = uStack_6a0._4_4_ * uStack_6a0._4_4_;
    local_6d8 = CONCAT44(fStack_844,local_848);
    uStack_6d0 = CONCAT44(fStack_83c,fStack_840);
    local_858 = local_848 * local_848;
    fStack_854 = fStack_844 * fStack_844;
    fStack_850 = fStack_840 * fStack_840;
    fStack_84c = fStack_83c * fStack_83c;
    local_580 = &local_858;
    local_348 = &local_7e8;
    local_350 = &local_7c8;
    local_308 = CONCAT44(fStack_854,local_858);
    uStack_300 = CONCAT44(fStack_84c,fStack_850);
    local_318 = 0xbc83a25cbc83a25c;
    uStack_310 = 0xbc83a25cbc83a25c;
    local_328 = local_858 * -0.01606863;
    fStack_324 = fStack_854 * -0.01606863;
    fStack_320 = fStack_850 * -0.01606863;
    fStack_31c = fStack_84c * -0.01606863;
    local_338 = 0xbd99b01ebd99b01e;
    uStack_330 = 0xbd99b01ebd99b01e;
    local_898 = local_328 + -0.07504295;
    fStack_894 = fStack_324 + -0.07504295;
    fStack_890 = fStack_320 + -0.07504295;
    fStack_88c = fStack_31c + -0.07504295;
    local_3a8 = &local_898;
    local_3b0 = &local_7a8;
    local_368 = CONCAT44(fStack_854,local_858);
    uStack_360 = CONCAT44(fStack_84c,fStack_850);
    local_378 = CONCAT44(fStack_894,local_898);
    uStack_370 = CONCAT44(fStack_88c,fStack_890);
    local_388 = local_858 * local_898;
    fStack_384 = fStack_854 * fStack_894;
    fStack_380 = fStack_850 * fStack_890;
    fStack_37c = fStack_84c * fStack_88c;
    local_398 = 0xbe117200be117200;
    uStack_390 = 0xbe117200be117200;
    local_888 = local_388 + -0.14203644;
    fStack_884 = fStack_384 + -0.14203644;
    fStack_880 = fStack_380 + -0.14203644;
    fStack_87c = fStack_37c + -0.14203644;
    local_408 = &local_888;
    local_410 = &local_788;
    local_3c8 = CONCAT44(fStack_854,local_858);
    uStack_3c0 = CONCAT44(fStack_84c,fStack_850);
    local_3d8 = CONCAT44(fStack_884,local_888);
    uStack_3d0 = CONCAT44(fStack_87c,fStack_880);
    local_3e8 = local_858 * local_888;
    fStack_3e4 = fStack_854 * fStack_884;
    fStack_3e0 = fStack_850 * fStack_880;
    fStack_3dc = fStack_84c * fStack_87c;
    local_3f8 = 0xbeaaaa53beaaaa53;
    uStack_3f0 = 0xbeaaaa53beaaaa53;
    local_878 = local_3e8 + -0.33333072;
    fStack_874 = fStack_3e4 + -0.33333072;
    fStack_870 = fStack_3e0 + -0.33333072;
    fStack_86c = fStack_3dc + -0.33333072;
    local_468 = &local_7f8;
    local_470 = &local_7d8;
    local_428 = CONCAT44(fStack_854,local_858);
    uStack_420 = CONCAT44(fStack_84c,fStack_850);
    local_438 = 0x3b3ac5373b3ac537;
    uStack_430 = 0x3b3ac5373b3ac537;
    local_448 = local_858 * 0.0028498897;
    fStack_444 = fStack_854 * 0.0028498897;
    fStack_440 = fStack_850 * 0.0028498897;
    fStack_43c = fStack_84c * 0.0028498897;
    local_458 = 0x3d2edd4e3d2edd4e;
    uStack_450 = 0x3d2edd4e3d2edd4e;
    local_8d8 = local_448 + 0.04269152;
    fStack_8d4 = fStack_444 + 0.04269152;
    fStack_8d0 = fStack_440 + 0.04269152;
    fStack_8cc = fStack_43c + 0.04269152;
    local_4c8 = &local_8d8;
    local_4d0 = &local_7b8;
    local_488 = CONCAT44(fStack_854,local_858);
    uStack_480 = CONCAT44(fStack_84c,fStack_850);
    local_498 = CONCAT44(fStack_8d4,local_8d8);
    uStack_490 = CONCAT44(fStack_8cc,fStack_8d0);
    local_4a8 = local_858 * local_8d8;
    fStack_4a4 = fStack_854 * fStack_8d4;
    fStack_4a0 = fStack_850 * fStack_8d0;
    fStack_49c = fStack_84c * fStack_8cc;
    local_4b8 = 0x3dd9ed243dd9ed24;
    uStack_4b0 = 0x3dd9ed243dd9ed24;
    local_8c8 = local_4a8 + 0.10640934;
    fStack_8c4 = fStack_4a4 + 0.10640934;
    fStack_8c0 = fStack_4a0 + 0.10640934;
    fStack_8bc = fStack_49c + 0.10640934;
    local_528 = &local_8c8;
    local_530 = &local_798;
    local_4e8 = CONCAT44(fStack_854,local_858);
    uStack_4e0 = CONCAT44(fStack_84c,fStack_850);
    local_4f8 = CONCAT44(fStack_8c4,local_8c8);
    uStack_4f0 = CONCAT44(fStack_8bc,fStack_8c0);
    local_508 = local_858 * local_8c8;
    fStack_504 = fStack_854 * fStack_8c4;
    fStack_500 = fStack_850 * fStack_8c0;
    fStack_4fc = fStack_84c * fStack_8bc;
    local_518 = 0x3e4cb9743e4cb974;
    uStack_510 = 0x3e4cb9743e4cb974;
    local_8b8 = local_508 + 0.1999262;
    fStack_8b4 = fStack_504 + 0.1999262;
    fStack_8b0 = fStack_500 + 0.1999262;
    fStack_8ac = fStack_4fc + 0.1999262;
    local_588 = &local_8b8;
    local_590 = &local_778;
    local_548 = CONCAT44(fStack_854,local_858);
    uStack_540 = CONCAT44(fStack_84c,fStack_850);
    local_558 = CONCAT44(fStack_8b4,local_8b8);
    uStack_550 = CONCAT44(fStack_8ac,fStack_8b0);
    local_568 = local_858 * local_8b8;
    fStack_564 = fStack_854 * fStack_8b4;
    fStack_560 = fStack_850 * fStack_8b0;
    fStack_55c = fStack_84c * fStack_8ac;
    local_578 = 0x3f8000003f800000;
    uStack_570 = 0x3f8000003f800000;
    local_8a8 = local_568 + 1.0;
    fStack_8a4 = fStack_564 + 1.0;
    fStack_8a0 = fStack_560 + 1.0;
    fStack_89c = fStack_55c + 1.0;
    local_5e0 = &local_848;
    local_5e8 = &local_878;
    local_5f0 = &local_8a8;
    local_5a8 = CONCAT44(fStack_844,local_848);
    uStack_5a0 = CONCAT44(fStack_83c,fStack_840);
    local_5b8 = CONCAT44(fStack_874,local_878);
    uStack_5b0 = CONCAT44(fStack_86c,fStack_870);
    local_5c8 = local_848 * local_878;
    fStack_5c4 = fStack_844 * fStack_874;
    fStack_5c0 = fStack_840 * fStack_870;
    fStack_5bc = fStack_83c * fStack_86c;
    local_5d8 = CONCAT44(fStack_8a4,local_8a8);
    uStack_5d0 = CONCAT44(fStack_89c,fStack_8a0);
    local_868 = local_5c8 + local_8a8;
    fStack_864 = fStack_5c4 + fStack_8a4;
    fStack_860 = fStack_5c0 + fStack_8a0;
    fStack_85c = fStack_5bc + fStack_89c;
    local_6e8 = CONCAT44(fStack_864,local_868);
    uStack_6e0 = CONCAT44(fStack_85c,fStack_860);
    local_6f8 = local_838._0_8_;
    uStack_6f0 = local_838._8_8_;
    local_708 = local_868 * (float)local_6a8;
    fStack_704 = fStack_864 * local_6a8._4_4_;
    fStack_700 = fStack_860 * (float)uStack_6a0;
    fStack_6fc = fStack_85c * uStack_6a0._4_4_;
    local_668 = CONCAT44(iStack_824,local_828);
    uStack_660 = CONCAT44(iStack_81c,iStack_820);
    uVar5 = local_668 & 0x3fc90fdb3fc90fdb;
    uVar6 = uStack_660 & 0x3fc90fdb3fc90fdb;
    local_718._0_4_ = (float)uVar5;
    local_718._4_4_ = (float)(uVar5 >> 0x20);
    uStack_710._0_4_ = (float)uVar6;
    uStack_710._4_4_ = (float)(uVar6 >> 0x20);
    local_2e8 = local_708 + (float)local_718;
    fStack_2e4 = fStack_704 + local_718._4_4_;
    fStack_2e0 = fStack_700 + (float)uStack_710;
    fStack_2dc = fStack_6fc + uStack_710._4_4_;
    uVar7 = CONCAT44(fStack_2e4,local_2e8) | local_808;
    uVar9 = CONCAT44(fStack_2dc,fStack_2e0) | uStack_800;
    local_bf8._0_4_ = (float)uVar7;
    local_bf8._4_4_ = (float)(uVar7 >> 0x20);
    uStack_bf0._0_4_ = (float)uVar9;
    uStack_bf0._4_4_ = (float)(uVar9 >> 0x20);
    local_c08._0_4_ = (float)local_cc8;
    local_c08._4_4_ = (float)(local_cc8 >> 0x20);
    uStack_c00._0_4_ = (float)uStack_cc0;
    uStack_c00._4_4_ = (float)(uStack_cc0 >> 0x20);
    local_cd8 = (float)local_bf8 + (float)local_c08;
    fStack_cd4 = local_bf8._4_4_ + local_c08._4_4_;
    fStack_cd0 = (float)uStack_bf0 + (float)uStack_c00;
    fStack_ccc = uStack_bf0._4_4_ + uStack_c00._4_4_;
    uVar8 = local_ca8 | 0x40490fdb40490fdb;
    uVar10 = uStack_ca0 | 0x40490fdb40490fdb;
    local_9f8._0_4_ = (float)uVar8;
    local_9f8._4_4_ = (float)(uVar8 >> 0x20);
    uStack_9f0._0_4_ = (float)uVar10;
    uStack_9f0._4_4_ = (float)(uVar10 >> 0x20);
    local_ce8 = -(uint)((float)local_9f8 < 0.0);
    iStack_ce4 = -(uint)(local_9f8._4_4_ < 0.0);
    iStack_ce0 = -(uint)((float)uStack_9f0 < 0.0);
    iStack_cdc = -(uint)(uStack_9f0._4_4_ < 0.0);
    local_b78 = CONCAT44(iStack_c84,local_c88);
    uStack_b70 = CONCAT44(iStack_c7c,iStack_c80);
    local_b88 = local_cb8 | 0x3fc90fdb3fc90fdb;
    uStack_b80 = uStack_cb0 | 0x3fc90fdb3fc90fdb;
    local_a98 = local_b78 & local_b88;
    uStack_a90 = uStack_b70 & uStack_b80;
    local_38 = CONCAT44(iStack_c84,local_c88);
    uStack_30 = CONCAT44(iStack_c7c,iStack_c80);
    local_b98 = CONCAT44(iStack_ce4,local_ce8);
    uStack_b90 = CONCAT44(iStack_cdc,iStack_ce0);
    local_a78 = local_b98 & 0x40490fdb40490fdb;
    uStack_a70 = uStack_b90 & 0x40490fdb40490fdb;
    local_18 = CONCAT44(iStack_ce4,local_ce8);
    uStack_10 = CONCAT44(iStack_cdc,iStack_ce0);
    local_a88 = 0;
    uStack_a80 = 0;
    local_aa8 = ~local_38 & local_a78;
    uStack_aa0 = ~uStack_30 & uStack_a70;
    local_cf8 = local_a98 | local_aa8;
    uStack_cf0 = uStack_a90 | uStack_aa0;
    local_bc8 = CONCAT44(fStack_cd4,local_cd8);
    uStack_bc0 = CONCAT44(fStack_ccc,fStack_cd0);
    local_ab8 = local_c98 & local_bc8;
    uStack_ab0 = uStack_c90 & uStack_bc0;
    local_58._0_4_ = (uint)local_c98;
    local_58._4_4_ = (uint)(local_c98 >> 0x20);
    uStack_50._0_4_ = (uint)uStack_c90;
    uStack_50._4_4_ = (uint)(uStack_c90 >> 0x20);
    local_68._0_4_ = (uint)local_cf8;
    local_68._4_4_ = (uint)(local_cf8 >> 0x20);
    uStack_60._0_4_ = (uint)uStack_cf0;
    uStack_60._4_4_ = (uint)(uStack_cf0 >> 0x20);
    local_ac8 = ((uint)local_58 ^ 0xffffffff) & (uint)local_68;
    uStack_ac4 = (local_58._4_4_ ^ 0xffffffff) & local_68._4_4_;
    uStack_ac0 = ((uint)uStack_50 ^ 0xffffffff) & (uint)uStack_60;
    uStack_abc = (uStack_50._4_4_ ^ 0xffffffff) & uStack_60._4_4_;
    local_d68 = local_ab8 | CONCAT44(uStack_ac4,local_ac8);
    uStack_d60 = uStack_ab0 | CONCAT44(uStack_abc,uStack_ac0);
    local_d50 = local_d90;
    *(ulong *)local_d90 = local_d68;
    *(ulong *)(local_d90 + 2) = uStack_d60;
    local_d80 = local_d80 + 1;
    local_d90 = local_d90 + 4;
    local_c18 = local_dc8;
    uStack_c10 = uStack_dc0;
    local_c08 = local_cc8;
    uStack_c00 = uStack_cc0;
    local_bf8 = uVar7;
    uStack_bf0 = uVar9;
    local_be8 = local_c28;
    uStack_be0 = uStack_c20;
    local_bd8 = local_dc8;
    uStack_bd0 = uStack_dc0;
    local_bb8 = local_c98;
    uStack_bb0 = uStack_c90;
    local_ba8 = local_c58;
    uStack_ba0 = uStack_c50;
    local_b48 = local_c48;
    uStack_b40 = uStack_c40;
    local_b28 = local_dc8;
    uStack_b20 = uStack_dc0;
    local_b18 = local_c48;
    uStack_b10 = uStack_c40;
    local_b08 = local_c28;
    uStack_b00 = uStack_c20;
    local_af8 = local_c48;
    uStack_af0 = uStack_c40;
    local_a68 = local_c68;
    uStack_a60 = uStack_c60;
    local_a58 = local_cb8;
    uStack_a50 = uStack_cb0;
    local_a48 = local_c58;
    uStack_a40 = uStack_c50;
    local_a38 = local_ca8;
    uStack_a30 = uStack_ca0;
    local_a28 = local_c58;
    uStack_a20 = uStack_c50;
    local_a08 = local_c38;
    uStack_a00 = uStack_c30;
    local_9f8 = uVar8;
    uStack_9f0 = uVar10;
    local_9e8 = local_c38;
    uStack_9e0 = uStack_c30;
    local_9d8 = local_dc8;
    uStack_9d0 = uStack_dc0;
    local_9c8 = local_c38;
    uStack_9c0 = uStack_c30;
    local_9b8 = local_c28;
    uStack_9b0 = uStack_c20;
    uStack_994 = local_998;
    uStack_990 = local_998;
    uStack_98c = local_998;
    uStack_974 = local_978;
    uStack_970 = local_978;
    uStack_96c = local_978;
    uStack_954 = local_958;
    uStack_950 = local_958;
    uStack_94c = local_958;
    uStack_934 = local_938;
    uStack_930 = local_938;
    uStack_92c = local_938;
    local_918 = local_c38;
    uStack_910 = uStack_c30;
    local_908 = local_dc8;
    uStack_900 = uStack_dc0;
    local_8f8 = local_c38;
    uStack_8f0 = uStack_c30;
    local_8e8 = local_c28;
    uStack_8e0 = uStack_c20;
    local_718 = uVar5;
    uStack_710 = uVar6;
    local_6c8 = local_6d8;
    uStack_6c0 = uStack_6d0;
    local_6a8 = local_6b8;
    uStack_6a0 = uStack_6b0;
    local_678 = local_768;
    uStack_670 = uStack_760;
    local_658 = local_818;
    uStack_650 = uStack_810;
    local_638 = local_758;
    uStack_630 = uStack_750;
    local_608 = local_738;
    uStack_600 = uStack_730;
    local_520 = local_580;
    local_4c0 = local_580;
    local_460 = local_580;
    local_400 = local_580;
    local_3a0 = local_580;
    local_340 = local_580;
    local_2f8 = local_808;
    uStack_2f0 = uStack_800;
    local_298 = local_818;
    uStack_290 = uStack_810;
    local_288 = local_748;
    uStack_280 = uStack_740;
    uStack_264 = local_268;
    uStack_260 = local_268;
    uStack_25c = local_268;
    uStack_244 = local_248;
    uStack_240 = local_248;
    uStack_23c = local_248;
    uStack_224 = local_228;
    uStack_220 = local_228;
    uStack_21c = local_228;
    uStack_204 = local_208;
    uStack_200 = local_208;
    uStack_1fc = local_208;
    uStack_1e4 = local_1e8;
    uStack_1e0 = local_1e8;
    uStack_1dc = local_1e8;
    uStack_1c4 = local_1c8;
    uStack_1c0 = local_1c8;
    uStack_1bc = local_1c8;
    uStack_1a4 = local_1a8;
    uStack_1a0 = local_1a8;
    uStack_19c = local_1a8;
    uStack_184 = local_188;
    uStack_180 = local_188;
    uStack_17c = local_188;
    uStack_164 = local_168;
    uStack_160 = local_168;
    uStack_15c = local_168;
    uStack_144 = local_148;
    uStack_140 = local_148;
    uStack_13c = local_148;
    uStack_124 = local_128;
    uStack_120 = local_128;
    uStack_11c = local_128;
    uStack_104 = local_108;
    uStack_100 = local_108;
    uStack_fc = local_108;
    uStack_e4 = local_e8;
    uStack_e0 = local_e8;
    uStack_dc = local_e8;
    local_c8 = local_748;
    uStack_c0 = uStack_740;
    local_a8 = local_818;
    uStack_a0 = uStack_810;
    local_78 = local_738;
    uStack_70 = uStack_730;
    local_68 = local_cf8;
    uStack_60 = uStack_cf0;
    local_58 = local_c98;
    uStack_50 = uStack_c90;
    local_48 = local_a78;
    uStack_40 = uStack_a70;
    local_28 = local_c38;
    uStack_20 = uStack_c30;
  }
  for (; local_da4 < local_d94; local_da4 = local_da4 + 1) {
    local_d00 = local_d99;
    local_d08 = local_d80;
    local_d10 = &local_da0;
    fVar4 = atan2f(*(float *)*local_d80,local_da0);
    *local_d90 = fVar4;
    local_d80 = (undefined1 (*) [16])(*local_d80 + 4);
    local_d90 = local_d90 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}